

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O0

void __thiscall PyreNet::Perceptron::Perceptron(Perceptron *this,int inputSize)

{
  int inputSize_local;
  Perceptron *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->weights);
  this->inputSize = inputSize;
  std::vector<double,_std::allocator<double>_>::resize(&this->weights,(long)(inputSize + 1));
  return;
}

Assistant:

Perceptron::Perceptron(int inputSize) {
        this->inputSize = inputSize;
        this->weights.resize(inputSize + 1);
    }